

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O0

int equal(char *s1,char *s2)

{
  char cVar1;
  char *c2;
  char *c1;
  char *s2_local;
  char *s1_local;
  
  c2 = s2;
  c1 = s1;
  do {
    if (*c1 != *c2) {
      return 0;
    }
    cVar1 = *c2;
    c2 = c2 + 1;
    c1 = c1 + 1;
  } while (cVar1 != '\0');
  return 1;
}

Assistant:

static int equal(s1, s2)
char *s1, *s2;
{
	register char *c1, *c2;

	c1 = s1;
	c2 = s2;
	while(*c1++ == *c2)
		if(*c2++ == 0)
			return(1);
	return(0);
}